

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool __thiscall V2Transport::ReceivedBytes(V2Transport *this,Span<const_unsigned_char> *msg_bytes)

{
  pointer puVar1;
  pointer puVar2;
  byte bVar3;
  bool bVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  pointer __n;
  byte unaff_R13B;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock47;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_device = &(this->m_recv_mutex).super_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_48);
  if (this->m_recv_state == V1) {
    bVar3 = V1Transport::ReceivedBytes(&this->m_v1_fallback,msg_bytes);
  }
  else {
    do {
      uVar7 = msg_bytes->m_size;
      if (uVar7 == 0) {
        bVar3 = 1;
        break;
      }
      sVar5 = GetMaxBytesToProcess(this);
      puVar1 = (this->m_recv_buffer).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (this->m_recv_buffer).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar6 = uVar7;
      if (sVar5 < uVar7) {
        uVar6 = sVar5;
      }
      if ((this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage + -(long)puVar1 <
          puVar2 + (uVar6 - (long)puVar1)) {
        __n = (pointer)0x100f;
        if (2 < this->m_recv_state) {
          if (1 < this->m_recv_state - 3) goto LAB_001a3fb3;
          uVar6 = uVar7 + 0x40000;
          if (sVar5 <= uVar7 + 0x40000) {
            uVar6 = sVar5;
          }
          __n = puVar2 + (uVar6 - (long)puVar1);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  (&this->m_recv_buffer,(size_type)__n);
      }
LAB_001a3fb3:
      uVar7 = msg_bytes->m_size;
      if (sVar5 < msg_bytes->m_size) {
        uVar7 = sVar5;
      }
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_recv_buffer,
                 (this->m_recv_buffer).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,msg_bytes->m_data,msg_bytes->m_data + uVar7);
      msg_bytes->m_data = msg_bytes->m_data + uVar7;
      msg_bytes->m_size = msg_bytes->m_size - uVar7;
      bVar4 = false;
      bVar3 = 1;
      switch(this->m_recv_state) {
      case KEY_MAYBE_V1:
        ProcessReceivedMaybeV1Bytes(this);
        if (this->m_recv_state != V1) goto switchD_001a3ffc_default;
        bVar4 = false;
        goto switchD_001a3ffc_caseD_5;
      case KEY:
        bVar4 = ProcessReceivedKeyBytes(this);
        break;
      case GARB_GARBTERM:
        bVar4 = ProcessReceivedGarbageBytes(this);
        break;
      case VERSION:
      case APP:
        bVar4 = ProcessReceivedPacketBytes(this);
        break;
      case APP_READY:
        goto switchD_001a3ffc_caseD_5;
      default:
        goto switchD_001a3ffc_default;
      }
      if (bVar4 == false) {
        bVar4 = false;
        bVar3 = 0;
      }
      else {
switchD_001a3ffc_default:
        bVar4 = true;
        bVar3 = unaff_R13B;
      }
switchD_001a3ffc_caseD_5:
      unaff_R13B = bVar3;
    } while (bVar4);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool V2Transport::ReceivedBytes(Span<const uint8_t>& msg_bytes) noexcept
{
    AssertLockNotHeld(m_recv_mutex);
    /** How many bytes to allocate in the receive buffer at most above what is received so far. */
    static constexpr size_t MAX_RESERVE_AHEAD = 256 * 1024;

    LOCK(m_recv_mutex);
    if (m_recv_state == RecvState::V1) return m_v1_fallback.ReceivedBytes(msg_bytes);

    // Process the provided bytes in msg_bytes in a loop. In each iteration a nonzero number of
    // bytes (decided by GetMaxBytesToProcess) are taken from the beginning om msg_bytes, and
    // appended to m_recv_buffer. Then, depending on the receiver state, one of the
    // ProcessReceived*Bytes functions is called to process the bytes in that buffer.
    while (!msg_bytes.empty()) {
        // Decide how many bytes to copy from msg_bytes to m_recv_buffer.
        size_t max_read = GetMaxBytesToProcess();

        // Reserve space in the buffer if there is not enough.
        if (m_recv_buffer.size() + std::min(msg_bytes.size(), max_read) > m_recv_buffer.capacity()) {
            switch (m_recv_state) {
            case RecvState::KEY_MAYBE_V1:
            case RecvState::KEY:
            case RecvState::GARB_GARBTERM:
                // During the initial states (key/garbage), allocate once to fit the maximum (4111
                // bytes).
                m_recv_buffer.reserve(MAX_GARBAGE_LEN + BIP324Cipher::GARBAGE_TERMINATOR_LEN);
                break;
            case RecvState::VERSION:
            case RecvState::APP: {
                // During states where a packet is being received, as much as is expected but never
                // more than MAX_RESERVE_AHEAD bytes in addition to what is received so far.
                // This means attackers that want to cause us to waste allocated memory are limited
                // to MAX_RESERVE_AHEAD above the largest allowed message contents size, and to
                // MAX_RESERVE_AHEAD more than they've actually sent us.
                size_t alloc_add = std::min(max_read, msg_bytes.size() + MAX_RESERVE_AHEAD);
                m_recv_buffer.reserve(m_recv_buffer.size() + alloc_add);
                break;
            }
            case RecvState::APP_READY:
                // The buffer is empty in this state.
                Assume(m_recv_buffer.empty());
                break;
            case RecvState::V1:
                // Should have bailed out above.
                Assume(false);
                break;
            }
        }

        // Can't read more than provided input.
        max_read = std::min(msg_bytes.size(), max_read);
        // Copy data to buffer.
        m_recv_buffer.insert(m_recv_buffer.end(), UCharCast(msg_bytes.data()), UCharCast(msg_bytes.data() + max_read));
        msg_bytes = msg_bytes.subspan(max_read);

        // Process data in the buffer.
        switch (m_recv_state) {
        case RecvState::KEY_MAYBE_V1:
            ProcessReceivedMaybeV1Bytes();
            if (m_recv_state == RecvState::V1) return true;
            break;

        case RecvState::KEY:
            if (!ProcessReceivedKeyBytes()) return false;
            break;

        case RecvState::GARB_GARBTERM:
            if (!ProcessReceivedGarbageBytes()) return false;
            break;

        case RecvState::VERSION:
        case RecvState::APP:
            if (!ProcessReceivedPacketBytes()) return false;
            break;

        case RecvState::APP_READY:
            return true;

        case RecvState::V1:
            // We should have bailed out before.
            Assume(false);
            break;
        }
        // Make sure we have made progress before continuing.
        Assume(max_read > 0);
    }

    return true;
}